

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O2

int __thiscall
CVmObjTimeZone::getp_getRules(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 in_register_00000034;
  long lVar3;
  
  if (oargc == (uint *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)(int)*oargc;
  }
  if (getp_getRules(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_getRules(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_getRules::desc.min_argc_ = 0;
      getp_getRules::desc.opt_argc_ = 0;
      getp_getRules::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getRules(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getRules::desc);
  if (iVar1 == 0) {
    vVar2 = CVmTimeZone::get_rule_list(*(CVmTimeZone **)(this->super_CVmObject).ext_);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
    sp_ = sp_ + -lVar3;
  }
  return 1;
}

Assistant:

int CVmObjTimeZone::getp_getRules(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the rule list */
    retval->set_obj(get_tz()->get_rule_list(vmg0_));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}